

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O3

void KConfigExport::dump_header(MetaConfiguration *conf,string *filename,string *exportHeader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MetaClass *top;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  QTextStream *pQVar5;
  QByteArrayView QVar6;
  string export_name;
  ofstream header;
  string local_280;
  QTextStream *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  string local_240;
  undefined8 local_220;
  undefined4 uStack_218;
  undefined8 uStack_214;
  undefined4 local_20c;
  undefined8 local_208;
  ios_base local_128 [264];
  
  dumpKConfigSource();
  if ((dumpKConfigSource()::category[0x10] & 1) != 0) {
    dumpKConfigSource();
    local_220._0_4_ = 2;
    local_220._4_4_ = 0;
    uStack_218 = 0;
    uStack_214 = 0;
    local_20c = 0;
    local_208 = dumpKConfigSource()::category._8_8_;
    QMessageLogger::debug();
    pQVar5 = local_260;
    QVar6.m_data = (storage_type *)0x25;
    QVar6.m_size = (qsizetype)&local_280;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar5,(QString *)&local_280);
    if ((QArrayData *)local_280._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_280._M_dataplus._M_p = *(int *)local_280._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_280._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_280._M_dataplus._M_p,2,8);
      }
    }
    if (local_260[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_260,' ');
    }
    operator<<((QDebug *)&local_260,filename);
    QDebug::~QDebug((QDebug *)&local_260);
  }
  std::ofstream::ofstream((ostream *)&local_220,(string *)filename,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"// clang-format off",0x13);
  std::ios::widen((char)(ostream *)&local_220 +
                  (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  begin_header_guards((ofstream *)&local_220,filename);
  std::ios::widen((char)(ofstream *)&local_220 +
                  (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  dump_notice((ofstream *)&local_220);
  paVar1 = &local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_280._M_dataplus._M_p = (pointer)paVar1;
  if (exportHeader->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"#include <",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_220,(exportHeader->_M_dataplus)._M_p,
                        exportHeader->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_export.h>",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    capitalize(&local_240,exportHeader,-1);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_240);
    pQVar5 = (QTextStream *)(plVar4 + 2);
    if ((QTextStream *)*plVar4 == pQVar5) {
      local_250 = *(long *)pQVar5;
      lStack_248 = plVar4[3];
      local_260 = (QTextStream *)&local_250;
    }
    else {
      local_250 = *(long *)pQVar5;
      local_260 = (QTextStream *)*plVar4;
    }
    local_258 = plVar4[1];
    *plVar4 = (long)pQVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_280,(string *)&local_260);
    if (local_260 != (QTextStream *)&local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"#include <functional>",0x15);
  std::ios::widen((char)(ostream *)&local_220 +
                  (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"#include <QObject>",0x12);
  std::ios::widen((char)(ostream *)&local_220 +
                  (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  std::ios::widen((char)&local_220 +
                  (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  dump_headers((ofstream *)&local_220,&conf->includes);
  cVar2 = (char)(ofstream *)&local_220;
  if ((conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::ios::widen((char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18) +
                    cVar2);
    std::ostream::put((char)&local_220);
    std::ostream::flush();
  }
  if ((conf->conf_namespace)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"namespace ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_220,(conf->conf_namespace)._M_dataplus._M_p,
                        (conf->conf_namespace)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," {",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::ios::widen((char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18) +
                    cVar2);
    std::ostream::put((char)&local_220);
    std::ostream::flush();
  }
  top = (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (top != (MetaClass *)0x0) {
    anon_unknown.dwarf_66021::dump_header_class(top,(ofstream *)&local_220,&local_280);
  }
  if ((conf->conf_namespace)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"}",1);
    std::ios::widen((char)(ostream *)&local_220 +
                    (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
    std::ostream::put((char)&local_220);
    std::ostream::flush();
  }
  std::ios::widen(cVar2 + (char)*(undefined8 *)
                                 (CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"// clang-format on",0x12);
  std::ios::widen((char)(ostream *)&local_220 +
                  (char)*(undefined8 *)(CONCAT44(local_220._4_4_,(undefined4)local_220) + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  local_220._0_4_ = (undefined4)_VTT;
  local_220._4_4_ = (undefined4)((ulong)_VTT >> 0x20);
  *(undefined8 *)((long)&local_220 + *(long *)(_VTT + -0x18)) = _operator<<;
  std::filebuf::~filebuf((filebuf *)&uStack_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void dump_header(
    const MetaConfiguration &conf,
    const std::string &filename,
    const std::string &exportHeader)
{
  qCDebug(dumpKConfigSource) << "Starting to dump the source file into" << filename;

  std::ofstream header(filename);
  // disable clang format for this, it's an automated file.

  header << "// clang-format off" << std::endl;

  begin_header_guards(header, filename);
  header << std::endl;

  dump_notice(header);

  std::string export_name;
  if (exportHeader.size() != 0) {
    header << "#include <" << exportHeader << "_export.h>" << std::endl;
    export_name = capitalize(exportHeader, -1) + "_EXPORT";
  }

  header << "#include <functional>" << std::endl;
  header << "#include <QObject>" << std::endl;

  header << std::endl;
  dump_headers(header, conf.includes);

  if (conf.includes.size()) {
    header << std::endl;
  }

  if (conf.conf_namespace.size()) {
    header << "namespace " << conf.conf_namespace << " {" << std::endl;
  }

  if (conf.includes.size()) {
    header << std::endl;
  }

  if (conf.top_level_class) {
    dump_header_class(conf.top_level_class.get(), header, export_name);
  }

  if (conf.conf_namespace.size()) {
    header << "}" << std::endl;
  }

  header << std::endl;
  header << "// clang-format on" << std::endl;
}